

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.hpp
# Opt level: O3

FilePath * de::FilePath::join(FilePath *__return_storage_ptr__,FilePath *a,FilePath *b)

{
  pointer pcVar1;
  int iVar2;
  long *local_60;
  long local_58;
  long local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (a->m_path)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (a->m_path)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar2 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_60);
  }
  else {
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &separator_abi_cxx11_,&b->m_path);
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->m_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_path).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_58 + (long)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline FilePath FilePath::join (const FilePath& a, const FilePath& b)
{
	return FilePath(a).join(b);
}